

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::ICUTranscoder::ICUTranscoder
          (ICUTranscoder *this,XMLCh *encodingName,UConverter *toAdopt,XMLSize_t blockSize,
          MemoryManager *manager)

{
  char cVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  
  XMLTranscoder::XMLTranscoder(&this->super_XMLTranscoder,encodingName,blockSize,manager);
  (this->super_XMLTranscoder)._vptr_XMLTranscoder = (_func_int **)&PTR__ICUTranscoder_004089e8;
  this->fConverter = toAdopt;
  this->fFixed = false;
  this->fSrcOffsets = (XMLUInt32 *)0x0;
  if (blockSize != 0) {
    iVar3 = (*manager->_vptr_MemoryManager[3])(manager,blockSize << 2);
    this->fSrcOffsets = (XMLUInt32 *)CONCAT44(extraout_var,iVar3);
    toAdopt = this->fConverter;
  }
  cVar1 = ucnv_getMaxCharSize_70(toAdopt);
  cVar2 = ucnv_getMinCharSize_70(this->fConverter);
  this->fFixed = cVar1 == cVar2;
  return;
}

Assistant:

ICUTranscoder::ICUTranscoder(const  XMLCh* const        encodingName
                            ,       UConverter* const   toAdopt
                            , const XMLSize_t           blockSize
                            , MemoryManager* const      manager) :

    XMLTranscoder(encodingName, blockSize, manager)
    , fConverter(toAdopt)
    , fFixed(false)
    , fSrcOffsets(0)
{
    // If there is a block size, then allocate our source offset array
    if (blockSize)
        fSrcOffsets = (XMLUInt32*) manager->allocate
        (
            blockSize * sizeof(XMLUInt32)
        );//new XMLUInt32[blockSize];

    // Remember if its a fixed size encoding
    fFixed = (ucnv_getMaxCharSize(fConverter) == ucnv_getMinCharSize(fConverter));
}